

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::StructDeclaration::isResolved(StructDeclaration *this)

{
  Member *pMVar1;
  size_t sVar2;
  long *plVar3;
  char cVar4;
  long lVar5;
  bool bVar6;
  
  if (this->isBeingResolved == false) {
    this->isBeingResolved = true;
    pMVar1 = (this->members).items;
    sVar2 = (this->members).numActive;
    lVar5 = 0;
    do {
      bVar6 = sVar2 * 0x28 - lVar5 == 0;
      if ((bVar6) ||
         (plVar3 = *(long **)((long)&(pMVar1->type).object + lVar5), (int)plVar3[5] != 1)) break;
      cVar4 = (**(code **)(*plVar3 + 0x18))();
      lVar5 = lVar5 + 0x28;
    } while (cVar4 != '\0');
    this->isBeingResolved = false;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool isResolved() const override
        {
            if (isBeingResolved)
                return false;

            ScopedResolver scopedResolver (isBeingResolved);

            for (auto& m : members)
                if (! isResolvedAsType (m.type.get()))
                    return false;

            return true;
        }